

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O1

ps_seg_t * ps_lattice_seg_next(ps_seg_t *seg)

{
  short sVar1;
  short sVar2;
  dag_seg_t *itor;
  ps_latlink_t *link;
  
  sVar2 = *(short *)((long)&seg[1].search + 6) + 1;
  *(short *)((long)&seg[1].search + 6) = sVar2;
  sVar1 = *(short *)((long)&seg[1].search + 4);
  if (sVar1 + 1 == (int)sVar2) {
    ckd_free(seg[1].vt);
    ckd_free(seg);
    seg = (ps_seg_t *)0x0;
  }
  else {
    if (sVar2 != sVar1) {
      link = (ps_latlink_t *)(&(seg[1].vt)->seg_next)[sVar2];
    }
    else {
      link = *(ps_latlink_t **)((long)seg[1].vt + (long)sVar2 * 8 + -8);
    }
    ps_lattice_link2itor(seg,link,(uint)(sVar2 == sVar1));
  }
  return seg;
}

Assistant:

static ps_seg_t *
ps_lattice_seg_next(ps_seg_t *seg)
{
    dag_seg_t *itor = (dag_seg_t *)seg;

    ++itor->cur;
    if (itor->cur == itor->n_links + 1) {
        ps_lattice_seg_free(seg);
        return NULL;
    }
    else if (itor->cur == itor->n_links) {
        /* Reuse the last link but with the "to" node. */
        ps_lattice_link2itor(seg, itor->links[itor->cur - 1], TRUE);
    }
    else {
        ps_lattice_link2itor(seg, itor->links[itor->cur], FALSE);
    }

    return seg;
}